

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent(QGraphicsSceneMouseEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *pQVar1;
  
  pQVar1 = (QGraphicsSceneEventPrivate *)operator_new(0xa0);
  pQVar1->widget = (QWidget *)0x0;
  pQVar1->q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1->timestamp = 0;
  pQVar1->_vptr_QGraphicsSceneEventPrivate =
       (_func_int **)&PTR__QGraphicsSceneMouseEventPrivate_00821e88;
  pQVar1[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[1].widget = (QWidget *)0x0;
  pQVar1[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1[1].timestamp = 0;
  pQVar1[2]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[2].widget = (QWidget *)0x0;
  pQVar1[2].q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1[2].timestamp = 0;
  pQVar1[3]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[3].widget = (QWidget *)0x0;
  pQVar1[3].q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1[3].timestamp = 0;
  pQVar1[4]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[4].widget = (QWidget *)0x0;
  *(undefined8 *)((long)&pQVar1[4].widget + 4) = 0;
  *(undefined8 *)((long)&pQVar1[4].q_ptr + 4) = 0;
  QEvent::QEvent((QEvent *)this,type);
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_00821bd0;
  (this->super_QGraphicsSceneEvent).d_ptr.d = pQVar1;
  pQVar1->q_ptr = &this->super_QGraphicsSceneEvent;
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_00821c00;
  return;
}

Assistant:

QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneMouseEventPrivate, type)
{
}